

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O1

void impact_drop(obj *missile,xchar x,xchar y,xchar dlev)

{
  short sVar1;
  int iVar2;
  int iVar3;
  obj *poVar4;
  level *lev;
  monst *mtmp;
  schar loc;
  boolean bVar5;
  boolean bVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  undefined7 in_register_00000011;
  xchar xVar12;
  undefined7 in_register_00000031;
  char *pcVar13;
  xchar xVar14;
  long lVar15;
  obj *obj;
  bool bVar16;
  bool peaceful;
  coord cc;
  byte local_91;
  coord local_8e;
  int local_8c;
  long local_88;
  int local_7c;
  long local_78;
  long local_70;
  long local_68;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  char *local_48;
  long local_40;
  monst *local_38;
  
  lVar15 = (long)(int)CONCAT71(in_register_00000031,x);
  local_50 = (long)(int)CONCAT71(in_register_00000011,y);
  if (level->objects[lVar15][local_50] == (obj *)0x0) {
    return;
  }
  local_8c = (int)x;
  local_7c = (int)y;
  loc = down_gate(x,y);
  drop_to(&local_8e,loc);
  if (local_8e.y == '\0') {
    return;
  }
  if (dlev == '\0') {
    local_88 = CONCAT71(local_88._1_7_,loc);
  }
  else {
    local_88 = CONCAT71(local_88._1_7_,9);
    local_8e.y = dlev;
  }
  xVar12 = (xchar)local_7c;
  xVar14 = (xchar)local_8c;
  bVar5 = costly_spot(xVar14,xVar12);
  lev = level;
  bVar16 = true;
  if (bVar5 != '\0') {
    pcVar8 = in_rooms(level,xVar14,xVar12,0x12);
    local_38 = shop_keeper(lev,*pcVar8);
    if (local_38 != (monst *)0x0) {
      local_70 = (long)*(int *)&local_38[0x1b].field_0x60;
      iVar2._0_1_ = local_38[0x1b].mtame;
      iVar2._1_1_ = local_38[0x1b].m_ap_type;
      iVar2._2_1_ = local_38[0x1b].mfrozen;
      iVar2._3_1_ = local_38[0x1b].mblinded;
      local_68 = (long)iVar2;
      local_91 = (local_38->field_0x62 & 0x40) >> 6;
      goto LAB_0017b758;
    }
  }
  local_70 = 0;
  local_68 = 0;
  local_91 = 1;
  local_38 = (monst *)0x0;
LAB_0017b758:
  if (missile != (obj *)0x0) {
    bVar16 = missile->otyp != 0x213;
  }
  obj = level->objects[lVar15][local_50];
  local_40 = lVar15;
  if (obj == (obj *)0x0) {
    local_78 = 0;
    local_88 = 0;
    lVar15 = 0;
  }
  else {
    local_54 = (int)(char)local_88;
    lVar15 = 0;
    local_58 = (int)local_8e.x;
    local_5c = (int)local_8e.y;
    local_48 = u.urooms;
    local_88 = 0;
    local_78 = 0;
    do {
      poVar4 = (obj->v).v_nexthere;
      if ((((obj != missile) && (lVar15 = lVar15 + obj->quan, obj != uball)) && (obj != uchain)) &&
         ((((obj->field_0x4b & 0x20) == 0 || ((ushort)(obj->otyp - 0xdaU) < 3)) &&
          ((bVar16 || (obj->otyp != 0x214)))))) {
        sVar1 = obj->otyp;
        uVar7 = mt_random();
        uVar10 = 3;
        if (sVar1 == 0x214) {
          uVar10 = 0x1e;
        }
        if ((int)((ulong)uVar7 % uVar10) == 0) {
          obj_extract_self(obj);
          lVar9 = local_88;
          if (bVar5 != '\0') {
            bVar6 = costly_spot(u.ux,u.uy);
            xVar14 = (xchar)local_7c;
            xVar12 = (xchar)local_8c;
            if (bVar6 == '\0') {
              peaceful = false;
            }
            else {
              pcVar8 = in_rooms(level,xVar12,xVar14,0x12);
              pcVar8 = strchr(local_48,(int)*pcVar8);
              xVar12 = (xchar)local_8c;
              peaceful = pcVar8 != (char *)0x0;
            }
            lVar9 = stolen_value(obj,xVar12,xVar14,peaceful,'\x01');
            if (obj->cobj != (obj *)0x0) {
              picked_container(obj);
            }
            lVar9 = lVar9 + local_88;
            if (obj->oclass != '\f') {
              obj->field_0x4a = obj->field_0x4a & 0xf7;
            }
          }
          deliver_object(obj,(xchar)local_58,(xchar)local_5c,local_54);
          local_78 = local_78 + obj->quan;
          local_88 = lVar9;
        }
      }
      obj = poVar4;
    } while (poVar4 != (obj *)0x0);
  }
  mtmp = local_38;
  lVar9 = local_88;
  if ((local_78 != 0) && ((viz_array[local_50][local_40] & 2U) != 0)) {
    pcVar8 = "object falls";
    if (local_78 != 1) {
      pcVar8 = "objects fall";
    }
    if (missile == (obj *)0x0) {
      if (lVar15 == local_78) {
        pcVar11 = "All the";
        if (local_78 == 1) {
          pcVar11 = "The";
        }
      }
      else {
        pcVar11 = "Some of the";
        pcVar8 = "objects fall";
        if (local_78 == 1) {
          pcVar11 = "One of the";
          pcVar8 = "objects falls";
        }
      }
      pline("%s adjacent %s %s.",pcVar11,pcVar8,gate_str);
    }
    else {
      pcVar11 = "";
      if (local_78 == 1) {
        pcVar11 = "an";
      }
      pcVar13 = "the ";
      if (local_78 != lVar15) {
        pcVar13 = pcVar11;
      }
      pline("From the impact, %sother %s.",pcVar13,pcVar8);
    }
  }
  if (((bVar5 != '\0') && (mtmp != (monst *)0x0)) && (lVar9 != 0)) {
    iVar3._0_1_ = mtmp[0x1b].mtame;
    iVar3._1_1_ = mtmp[0x1b].m_ap_type;
    iVar3._2_1_ = mtmp[0x1b].mfrozen;
    iVar3._3_1_ = mtmp[0x1b].mblinded;
    if (local_68 < iVar3) {
      pcVar8 = currency(lVar9);
      pline("You removed %ld %s worth of goods!",lVar9,pcVar8);
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        You_hear("a scream, \"Thief!\"");
      }
      else {
        if (mtmp[0x1b].field_0x75 == '\0') {
          strncpy(&mtmp[0x1b].field_0x75,plname,0x20);
        }
        if (local_91 == 0) {
          pcVar8 = Monnam(mtmp);
          pcVar11 = "%s is infuriated!";
        }
        else {
          pcVar11 = "\"%s, you are a thief!\"";
          pcVar8 = plname;
        }
        pline(pcVar11,pcVar8);
      }
      hot_pursuit(mtmp);
      angry_guards('\0');
      return;
    }
    lVar15 = *(int *)&mtmp[0x1b].field_0x60 - local_70;
    if (lVar15 != 0 && local_70 <= *(int *)&mtmp[0x1b].field_0x60) {
      pcVar8 = Monnam(mtmp);
      pcVar11 = currency(lVar15);
      pline("You owe %s %ld %s for goods lost.",pcVar8,lVar15,pcVar11);
      return;
    }
  }
  return;
}

Assistant:

void impact_drop(struct obj *missile, xchar x, xchar y, xchar dlev)
{
	schar toloc;
	struct obj *obj, *obj2;
	struct monst *shkp;
	long oct, dct, price, debit, robbed;
	boolean angry, costly, isrock;
	coord cc;

	if (!OBJ_AT(x, y)) return;

	toloc = down_gate(x, y);
	drop_to(&cc, toloc);
	if (!cc.y) return;

	if (dlev) {
		/* send objects next to player falling through trap door.
		 * checked in obj_delivery().
		 */
		toloc = MIGR_NEAR_PLAYER;
		cc.y = dlev;
	}

	costly = costly_spot(x, y);
	price = debit = robbed = 0L;
	angry = FALSE;
	shkp = NULL;
	/* if 'costly', we must keep a record of ESHK(shkp) before
	 * it undergoes changes through the calls to stolen_value.
	 * the angry bit must be reset, if needed, in this fn, since
	 * stolen_value is called under the 'silent' flag to avoid
	 * unsavory pline repetitions.
	 */
	if (costly) {
	    if ((shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) != 0) {
		debit	= ESHK(shkp)->debit;
		robbed	= ESHK(shkp)->robbed;
		angry	= !shkp->mpeaceful;
	    }
	}

	isrock = (missile && missile->otyp == ROCK);
	oct = dct = 0L;
	for (obj = level->objects[x][y]; obj; obj = obj2) {
		obj2 = obj->nexthere;
		if (obj == missile) continue;
		/* number of objects in the pile */
		oct += obj->quan;
		if (obj == uball || obj == uchain) continue;
		/* level prizes never fall */
		if (Is_prize(obj)) continue;
		/* boulders can fall too, but rarely & never due to rocks */
		if ((isrock && obj->otyp == BOULDER) ||
		   rn2(obj->otyp == BOULDER ? 30 : 3)) continue;
		obj_extract_self(obj);

		if (costly) {
		    price += stolen_value(obj, x, y,
				(costly_spot(u.ux, u.uy) &&
				 strchr(u.urooms, *in_rooms(level, x, y, SHOPBASE))),
				TRUE);
		    /* set obj->no_charge to 0 */
		    if (Has_contents(obj))
			picked_container(obj);	/* does the right thing */
		    if (obj->oclass != COIN_CLASS)
			obj->no_charge = 0;
		}

		deliver_object(obj, cc.x, cc.y, toloc);

		/* number of fallen objects */
		dct += obj->quan;
	}

	if (dct && cansee(x,y)) {	/* at least one object fell */
	    const char *what = (dct == 1L ? "object falls" : "objects fall");

	    if (missile)
		pline("From the impact, %sother %s.",
		      dct == oct ? "the " : dct == 1L ? "an" : "", what);
	    else if (oct == dct)
		pline("%s adjacent %s %s.",
		      dct == 1L ? "The" : "All the", what, gate_str);
	    else
		pline("%s adjacent %s %s.",
		      dct == 1L ? "One of the" : "Some of the",
		      dct == 1L ? "objects falls" : what, gate_str);
	}

	if (costly && shkp && price) {
		if (ESHK(shkp)->robbed > robbed) {
		    pline("You removed %ld %s worth of goods!", price, currency(price));
		    if (cansee(shkp->mx, shkp->my)) {
			if (ESHK(shkp)->customer[0] == 0)
			    strncpy(ESHK(shkp)->customer,
					   plname, PL_NSIZ);
			if (angry)
			    pline("%s is infuriated!", Monnam(shkp));
			else pline("\"%s, you are a thief!\"", plname);
		    } else  You_hear("a scream, \"Thief!\"");
		    hot_pursuit(shkp);
		    angry_guards(FALSE);
		    return;
		}
		if (ESHK(shkp)->debit > debit) {
		    long amt = (ESHK(shkp)->debit - debit);
		    pline("You owe %s %ld %s for goods lost.",
			Monnam(shkp),
			amt, currency(amt));
		}
	}

}